

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O2

bool __thiscall CCollision::IsTile(CCollision *this,int x,int y,int Flag)

{
  uint uVar1;
  
  uVar1 = GetTile(this,x,y);
  return (uVar1 & Flag) != 0;
}

Assistant:

bool CCollision::IsTile(int x, int y, int Flag) const
{
	return GetTile(x, y)&Flag;
}